

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O2

uint highbd_masked_sad8xh_avx2
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [16];
  int iVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  pauVar5 = (undefined1 (*) [16])((long)src8 * 2);
  pauVar3 = (undefined1 (*) [16])((long)a8 * 2);
  pauVar6 = (undefined1 (*) [16])((long)b8 * 2);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar9._8_2_ = 0x40;
  auVar9._0_8_ = 0x40004000400040;
  auVar9._10_2_ = 0x40;
  auVar9._12_2_ = 0x40;
  auVar9._14_2_ = 0x40;
  auVar9._16_2_ = 0x40;
  auVar9._18_2_ = 0x40;
  auVar9._20_2_ = 0x40;
  auVar9._22_2_ = 0x40;
  auVar9._24_2_ = 0x40;
  auVar9._26_2_ = 0x40;
  auVar9._28_2_ = 0x40;
  auVar9._30_2_ = 0x40;
  auVar10._8_4_ = 0x20;
  auVar10._0_8_ = 0x2000000020;
  auVar10._12_4_ = 0x20;
  auVar10._16_4_ = 0x20;
  auVar10._20_4_ = 0x20;
  auVar10._24_4_ = 0x20;
  auVar10._28_4_ = 0x20;
  auVar11._8_2_ = 1;
  auVar11._0_8_ = 0x1000100010001;
  auVar11._10_2_ = 1;
  auVar11._12_2_ = 1;
  auVar11._14_2_ = 1;
  auVar11._16_2_ = 1;
  auVar11._18_2_ = 1;
  auVar11._20_2_ = 1;
  auVar11._22_2_ = 1;
  auVar11._24_2_ = 1;
  auVar11._26_2_ = 1;
  auVar11._28_2_ = 1;
  auVar11._30_2_ = 1;
  for (iVar4 = 0; auVar7 = auVar8._0_32_, iVar4 < height; iVar4 = iVar4 + 2) {
    auVar12._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + (long)src_stride * 2) +
         ZEXT116(1) * *pauVar5;
    auVar12._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + (long)src_stride * 2);
    auVar13._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar3 + (long)a_stride * 2) + ZEXT116(1) * *pauVar3;
    auVar13._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar3 + (long)a_stride * 2);
    auVar15._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + (long)b_stride * 2) + ZEXT116(1) * *pauVar6;
    auVar15._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + (long)b_stride * 2);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)((long)m_ptr + (long)m_stride);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)m_ptr;
    auVar16 = vpunpcklqdq_avx(auVar17,auVar16);
    auVar1 = vpmovzxbw_avx2(auVar16);
    auVar2 = vpsubw_avx2(auVar9,auVar1);
    auVar14 = vpunpcklwd_avx2(auVar13,auVar15);
    auVar18 = vpunpcklwd_avx2(auVar1,auVar2);
    auVar14 = vpmaddwd_avx2(auVar14,auVar18);
    auVar14 = vpaddd_avx2(auVar14,auVar10);
    auVar18 = vpsrad_avx2(auVar14,6);
    auVar14 = vpunpckhwd_avx2(auVar13,auVar15);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
    auVar14 = vpmaddwd_avx2(auVar14,auVar1);
    auVar14 = vpaddd_avx2(auVar14,auVar10);
    auVar14 = vpsrad_avx2(auVar14,6);
    auVar14 = vpackssdw_avx2(auVar18,auVar14);
    auVar14 = vpsubw_avx2(auVar14,auVar12);
    auVar14 = vpabsw_avx2(auVar14);
    auVar14 = vpmaddwd_avx2(auVar14,auVar11);
    auVar7 = vpaddd_avx2(auVar14,auVar7);
    auVar8 = ZEXT3264(auVar7);
    m_ptr = (uint8_t *)((long)m_ptr + (long)(m_stride * 2));
    pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)(b_stride * 2) * 2);
    pauVar3 = (undefined1 (*) [16])(*pauVar3 + (long)(a_stride * 2) * 2);
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + (long)(src_stride * 2) * 2);
  }
  auVar9 = vphaddd_avx2(auVar7,auVar7);
  auVar9 = vphaddd_avx2(auVar9,auVar9);
  auVar16 = vpaddd_avx(auVar9._0_16_,auVar9._16_16_);
  return auVar16._0_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad8xh_avx2(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i one = _mm256_set1_epi16(1);

  for (y = 0; y < height; y += 2) {
    const __m256i src = yy_loadu2_128(src_ptr + src_stride, src_ptr);
    const __m256i a = yy_loadu2_128(a_ptr + a_stride, a_ptr);
    const __m256i b = yy_loadu2_128(b_ptr + b_stride, b_ptr);
    // Zero-extend mask to 16 bits
    const __m256i m = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)(m_ptr)),
        _mm_loadl_epi64((const __m128i *)(m_ptr + m_stride))));
    const __m256i m_inv = _mm256_sub_epi16(mask_max, m);

    const __m256i data_l = _mm256_unpacklo_epi16(a, b);
    const __m256i mask_l = _mm256_unpacklo_epi16(m, m_inv);
    __m256i pred_l = _mm256_madd_epi16(data_l, mask_l);
    pred_l = _mm256_srai_epi32(_mm256_add_epi32(pred_l, round_const),
                               AOM_BLEND_A64_ROUND_BITS);

    const __m256i data_r = _mm256_unpackhi_epi16(a, b);
    const __m256i mask_r = _mm256_unpackhi_epi16(m, m_inv);
    __m256i pred_r = _mm256_madd_epi16(data_r, mask_r);
    pred_r = _mm256_srai_epi32(_mm256_add_epi32(pred_r, round_const),
                               AOM_BLEND_A64_ROUND_BITS);

    // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
    // so it is safe to do signed saturation here.
    const __m256i pred = _mm256_packs_epi32(pred_l, pred_r);
    // There is no 16-bit SAD instruction, so we have to synthesize
    // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
    // and accumulating them at the end
    const __m256i diff = _mm256_abs_epi16(_mm256_sub_epi16(pred, src));
    res = _mm256_add_epi32(res, _mm256_madd_epi16(diff, one));

    src_ptr += src_stride << 1;
    a_ptr += a_stride << 1;
    b_ptr += b_stride << 1;
    m_ptr += m_stride << 1;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int sad = _mm256_extract_epi32(res, 0) + _mm256_extract_epi32(res, 4);
  return sad;
}